

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

MessageLite *
google::protobuf::internal::TcParser::AddMessage
          (TcParseTableBase *table,RepeatedPtrFieldBase *field)

{
  MessageLite *pMVar1;
  RepeatedPtrFieldBase *field_local;
  TcParseTableBase *table_local;
  
  pMVar1 = (MessageLite *)
           RepeatedPtrFieldBase::
           AddInternal<google::protobuf::internal::TcParser::AddMessage(google::protobuf::internal::TcParseTableBase_const*,google::protobuf::internal::RepeatedPtrFieldBase&)::__0>
                     (field,(anon_class_8_1_a8aa2aee)table);
  return pMVar1;
}

Assistant:

MessageLite* TcParser::AddMessage(const TcParseTableBase* table,
                                  RepeatedPtrFieldBase& field) {
  return static_cast<MessageLite*>(field.AddInternal(
      [table](Arena* arena) { return NewMessage(table, arena); }));
}